

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testSerializeToStringHeartbeat(int count)

{
  long lVar1;
  string local_198 [36];
  int local_174;
  long lStack_170;
  int i;
  long start;
  Heartbeat message;
  int count_local;
  
  message.super_Message._340_4_ = count;
  FIX42::Heartbeat::Heartbeat((Heartbeat *)&start);
  message.super_Message._340_4_ = message.super_Message._340_4_ + -1;
  lStack_170 = GetTickCount();
  for (local_174 = 0; local_174 <= (int)message.super_Message._340_4_; local_174 = local_174 + 1) {
    FIX::Message::toString_abi_cxx11_((int)local_198,(int)&start,8);
    std::__cxx11::string::~string(local_198);
  }
  lVar1 = GetTickCount();
  lVar1 = lVar1 - lStack_170;
  FIX42::Heartbeat::~Heartbeat((Heartbeat *)&start);
  return lVar1;
}

Assistant:

long testSerializeToStringHeartbeat( int count )
{
  FIX42::Heartbeat message;
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    message.toString();
  }
  return GetTickCount() - start;
}